

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-sw.c
# Opt level: O2

void sha512_sw_write(BinarySink *bs,void *vp,size_t len)

{
  BinarySink **ppBVar1;
  BinarySink *pBVar2;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var3;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var4;
  long lVar5;
  uint round_index;
  ulong uVar6;
  uint64_t f;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_350;
  uint64_t g;
  uint64_t a;
  BinarySink *local_338;
  uint64_t d;
  uint64_t c;
  void *local_320;
  uint64_t e;
  uint64_t b;
  ulong local_308;
  _func_void_BinarySink_ptr_void_ptr_size_t *local_300;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_2f8;
  BinarySink *local_2f0;
  _func_void_BinarySink_ptr_void_ptr_size_t *local_2e8;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_2e0;
  BinarySink *local_2d8;
  _func_void_BinarySink_ptr_void_ptr_size_t *local_2d0;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_2c8;
  BinarySink **local_2c0;
  uint64_t w [80];
  
  local_2c0 = &bs[-7].binarysink_;
  local_338 = bs;
  while (len != 0) {
    uVar6 = 0x80 - (long)bs[-1].write;
    if (len < uVar6) {
      uVar6 = len;
    }
    local_320 = vp;
    local_308 = len;
    memcpy(bs[-1].write + (long)local_2c0,vp,uVar6);
    vp = (void *)((long)local_320 + uVar6);
    len = local_308 - uVar6;
    p_Var3 = local_338[-1].write;
    local_338[-1].write = p_Var3 + uVar6;
    ppBVar1 = &local_338[-1].binarysink_;
    pBVar2 = *ppBVar1;
    *ppBVar1 = (BinarySink *)(&(*ppBVar1)->write + uVar6);
    local_338[-1].writefmtv = local_338[-1].writefmtv + CARRY8((ulong)pBVar2,uVar6 * 8);
    bs = local_338;
    if (p_Var3 + uVar6 == (_func_void_BinarySink_ptr_void_ptr_size_t *)0x80) {
      local_338[-1].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        uVar6 = *(ulong *)((long)local_338 + lVar5 * 8 + -0x98);
        w[lVar5] = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                   (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                   (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28
                   | uVar6 << 0x38;
      }
      for (lVar5 = 0x10; lVar5 != 0x50; lVar5 = lVar5 + 1) {
        uVar6 = (&d)[lVar5];
        p_Var4 = (&local_2c8)[lVar5];
        w[lVar5] = (long)&(&local_338)[lVar5]->write +
                   (long)&(&local_2f0)[lVar5]->write +
                   ((ulong)p_Var4 >> 6 ^
                   ((long)p_Var4 << 3 | (ulong)p_Var4 >> 0x3d) ^
                   ((long)p_Var4 << 0x2d | (ulong)p_Var4 >> 0x13)) +
                   (uVar6 >> 7 ^
                   (uVar6 << 0x38 | uVar6 >> 8) ^ (uVar6 >> 1 | (ulong)((uVar6 & 1) != 0) << 0x3f));
      }
      a = (uint64_t)local_338[-9].write;
      b = (uint64_t)local_338[-9].writefmtv;
      c = (uint64_t)local_338[-9].binarysink_;
      d = (uint64_t)local_338[-8].write;
      e = (uint64_t)local_338[-8].writefmtv;
      f = (uint64_t)local_338[-8].binarysink_;
      g = (uint64_t)local_338[-7].write;
      local_350 = local_338[-7].writefmtv;
      local_320 = vp;
      local_308 = len;
      local_300 = (_func_void_BinarySink_ptr_void_ptr_size_t *)a;
      local_2f8 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)b;
      local_2f0 = (BinarySink *)c;
      local_2e8 = (_func_void_BinarySink_ptr_void_ptr_size_t *)d;
      local_2e0 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)e;
      local_2d8 = (BinarySink *)f;
      local_2d0 = (_func_void_BinarySink_ptr_void_ptr_size_t *)g;
      local_2c8 = local_350;
      for (round_index = 0; bs = local_338, round_index < 0x50; round_index = round_index + 8) {
        sha512_sw_round(round_index,w,&a,&b,&c,&d,&e,&f,&g,(uint64_t *)&local_350);
        sha512_sw_round(round_index + 1,w,(uint64_t *)&local_350,&a,&b,&c,&d,&e,&f,&g);
        sha512_sw_round(round_index + 2,w,&g,(uint64_t *)&local_350,&a,&b,&c,&d,&e,&f);
        sha512_sw_round(round_index + 3,w,&f,&g,(uint64_t *)&local_350,&a,&b,&c,&d,&e);
        sha512_sw_round(round_index + 4,w,&e,&f,&g,(uint64_t *)&local_350,&a,&b,&c,&d);
        sha512_sw_round(round_index + 5,w,&d,&e,&f,&g,(uint64_t *)&local_350,&a,&b,&c);
        sha512_sw_round(round_index + 6,w,&c,&d,&e,&f,&g,(uint64_t *)&local_350,&a,&b);
        sha512_sw_round(round_index + 7,w,&b,&c,&d,&e,&f,&g,(uint64_t *)&local_350,&a);
      }
      local_338[-9].write = local_300 + a;
      local_338[-9].writefmtv = local_2f8 + b;
      local_338[-9].binarysink_ = (BinarySink *)((long)&local_2f0->write + c);
      local_338[-8].write = local_2e8 + d;
      local_338[-8].writefmtv = local_2e0 + e;
      local_338[-8].binarysink_ = (BinarySink *)((long)&local_2d8->write + f);
      local_338[-7].write = local_2d0 + g;
      local_338[-7].writefmtv = local_2c8 + (long)local_350;
      smemclr(w,0x280);
      len = local_308;
      vp = local_320;
    }
  }
  return;
}

Assistant:

static void sha512_sw_write(BinarySink *bs, const void *vp, size_t len)
{
    sha512_sw *s = BinarySink_DOWNCAST(bs, sha512_sw);

    while (len > 0)
        if (sha512_block_write(&s->blk, &vp, &len))
            sha512_sw_block(s->core, s->blk.block);
}